

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O0

void * __thiscall
JsUtil::Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
          (Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *this)

{
  Type pvVar1;
  int iVar2;
  Type *ppvVar3;
  void *item;
  Stack<void_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_local;
  
  iVar2 = ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer> *)this);
  ppvVar3 = List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Item
                      (&this->list,iVar2 + -1);
  pvVar1 = *ppvVar3;
  iVar2 = ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    ((ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer> *)this);
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::RemoveAt
            (&this->list,iVar2 + -1);
  return pvVar1;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }